

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_tile(AV1Decoder *pbi,ThreadData *td,int tile_row,int tile_col)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  DecoderCodingBlock *in_RSI;
  AV1Decoder *in_RDI;
  int corrupted;
  int mi_col;
  int mi_row;
  MACROBLOCKD *xd;
  DecoderCodingBlock *dcb;
  int num_planes;
  AV1_COMMON *cm;
  TileInfo tile_info;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  DecoderCodingBlock *dcb_00;
  AV1_COMMON *cm_00;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int iVar3;
  int in_stack_ffffffffffffffdc;
  AV1_COMMON *in_stack_ffffffffffffffe0;
  
  cm_00 = &in_RDI->common;
  iVar1 = av1_num_planes(cm_00);
  av1_tile_set_row((TileInfo *)&stack0xffffffffffffffd0,cm_00,in_EDX);
  av1_tile_set_col((TileInfo *)&stack0xffffffffffffffd0,cm_00,in_ECX);
  dcb_00 = in_RSI;
  av1_zero_above_context
            (in_stack_ffffffffffffffe0,
             (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,(int)((ulong)cm_00 >> 0x20));
  av1_reset_loop_filter_delta(&in_RSI->xd,iVar1);
  local_54 = in_stack_ffffffffffffffd0;
  av1_reset_loop_restoration
            ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c);
  local_58 = in_stack_ffffffffffffffd8;
  do {
    if (in_stack_ffffffffffffffd4 <= local_54) {
      iVar1 = check_trailing_bits_after_symbol_coder((aom_reader *)dcb_00);
      aom_merge_corrupted_flag(&dcb_00->corrupted,(uint)(iVar1 != 0));
      return;
    }
    av1_zero_left_context((MACROBLOCKD *)0x12087e6);
    iVar3 = local_58;
    for (; local_58 < in_stack_ffffffffffffffdc; local_58 = cm_00->seq_params->mib_size + local_58)
    {
      set_cb_buffer(in_RDI,dcb_00,(CB_BUFFER *)(in_RSI + 1),iVar1,0,0);
      decode_partition((AV1Decoder *)CONCAT44(tile_row,tile_col),(ThreadData *)tile_info._16_8_,
                       tile_info.mi_col_end,tile_info.mi_col_start,(aom_reader *)tile_info._0_8_,
                       cm._7_1_,(int)pbi);
      iVar2 = aom_reader_has_overflowed
                        ((aom_reader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                        );
      if (iVar2 != 0) {
        aom_merge_corrupted_flag(&dcb_00->corrupted,1);
        return;
      }
    }
    local_54 = cm_00->seq_params->mib_size + local_54;
    local_58 = iVar3;
  } while( true );
}

Assistant:

static inline void decode_tile(AV1Decoder *pbi, ThreadData *const td,
                               int tile_row, int tile_col) {
  TileInfo tile_info;

  AV1_COMMON *const cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);

  av1_tile_set_row(&tile_info, cm, tile_row);
  av1_tile_set_col(&tile_info, cm, tile_col);
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;

  av1_zero_above_context(cm, xd, tile_info.mi_col_start, tile_info.mi_col_end,
                         tile_row);
  av1_reset_loop_filter_delta(xd, num_planes);
  av1_reset_loop_restoration(xd, num_planes);

  for (int mi_row = tile_info.mi_row_start; mi_row < tile_info.mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    av1_zero_left_context(xd);

    for (int mi_col = tile_info.mi_col_start; mi_col < tile_info.mi_col_end;
         mi_col += cm->seq_params->mib_size) {
      set_cb_buffer(pbi, dcb, &td->cb_buffer_base, num_planes, 0, 0);

      // Bit-stream parsing and decoding of the superblock
      decode_partition(pbi, td, mi_row, mi_col, td->bit_reader,
                       cm->seq_params->sb_size, 0x3);

      if (aom_reader_has_overflowed(td->bit_reader)) {
        aom_merge_corrupted_flag(&dcb->corrupted, 1);
        return;
      }
    }
  }

  int corrupted =
      (check_trailing_bits_after_symbol_coder(td->bit_reader)) ? 1 : 0;
  aom_merge_corrupted_flag(&dcb->corrupted, corrupted);
}